

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

Function * __thiscall LinkedObjectFile::get_function_at_label(LinkedObjectFile *this,int label_id)

{
  pointer pLVar1;
  pointer pvVar2;
  Function *pFVar3;
  Function *func;
  Function *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)label_id;
  pLVar1 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pLVar1 >> 3) * -0x3333333333333333;
  if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
    uVar7 = (ulong)pLVar1[uVar6].target_segment;
    pvVar2 = (this->functions_by_seg).
             super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->functions_by_seg).
                   super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    if (uVar7 <= uVar5 && uVar5 - uVar7 != 0) {
      pFVar4 = pvVar2[uVar7].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar3 = *(pointer *)
                ((long)&pvVar2[uVar7].super__Vector_base<Function,_std::allocator<Function>_>.
                        _M_impl.super__Vector_impl_data + 8);
      if (pFVar4 != pFVar3) {
        do {
          if (pFVar4->start_word * 4 + 4 == pLVar1[uVar6].offset) {
            return pFVar4;
          }
          pFVar4 = pFVar4 + 1;
        } while (pFVar4 != pFVar3);
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x5c,"Function &LinkedObjectFile::get_function_at_label(int)");
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Function& LinkedObjectFile::get_function_at_label(int label_id) {
  auto& label = labels.at(label_id);
  for (auto& func : functions_by_seg.at(label.target_segment)) {
    // + 4 to skip past type tag to the first word, which is were the label points.
    if (func.start_word * 4 + 4 == label.offset) {
      return func;
    }
  }

  assert(false);
  return functions_by_seg.front().front(); // to avoid error
}